

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawequal(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  undefined4 uVar2;
  cTValue *in_RSI;
  cTValue *in_RDI;
  TRef unaff_retaddr;
  TRef unaff_retaddr_00;
  jit_State *in_stack_00000008;
  int diff;
  TRef trb;
  TRef tra;
  
  if ((*(int *)in_RDI[0x11] != 0) && (*(int *)(in_RDI[0x11].u64 + 4) != 0)) {
    iVar1 = lj_record_objcmp(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI);
    uVar2 = 0x2007ffd;
    if (iVar1 != 0) {
      uVar2 = 0x1007ffe;
    }
    *(undefined4 *)in_RDI[0x11] = uVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawequal(jit_State *J, RecordFFData *rd)
{
  TRef tra = J->base[0];
  TRef trb = J->base[1];
  if (tra && trb) {
    int diff = lj_record_objcmp(J, tra, trb, &rd->argv[0], &rd->argv[1]);
    J->base[0] = diff ? TREF_FALSE : TREF_TRUE;
  }  /* else: Interpreter will throw. */
}